

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>::moveAppend
          (QGenericArrayOps<std::pair<QByteArray,_QByteArray>_> *this,
          pair<QByteArray,_QByteArray> *b,pair<QByteArray,_QByteArray> *e)

{
  qsizetype *pqVar1;
  pair<QByteArray,_QByteArray> *ppVar2;
  
  if (b != e) {
    ppVar2 = (this->super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>).ptr;
    for (; b < e; b = b + 1) {
      std::pair<QByteArray,_QByteArray>::pair
                (ppVar2 + (this->super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>).size,b
                );
      pqVar1 = &(this->super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }